

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O2

void __thiscall
QHttp2ProtocolHandler::finishStream
          (QHttp2ProtocolHandler *this,QHttp2Stream *stream,ConnectionType connectionType)

{
  ContextType *object;
  int iVar1;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar2;
  QLoggingCategory *pQVar3;
  QDebug *pQVar4;
  QHttpNetworkRequestPrivate *pQVar5;
  long in_FS_OFFSET;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 local_4c;
  char *local_48;
  QDebug local_40;
  QHttp2Stream *stream_local;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  stream_local = stream;
  if (stream->m_state != Closed) {
    QHttp2Stream::sendRST_STREAM((QHttp2Stream *)stream,CANCEL);
  }
  ppVar2 = QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::operator[]
                     ((QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *
                      )(this + 0x50),&stream_local);
  object = ppVar2->second;
  if (object != (ContextType *)0x0) {
    iVar1 = QHttpNetworkReply::statusCode((QHttpNetworkReply *)object);
    if ((iVar1 == 0x197) || (iVar1 == 0x191)) {
      handleAuthorization(this,stream_local);
    }
    else {
      QObject::disconnect(&object->super_QObject,(QObject *)this,(char *)0x0);
      pQVar5 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->(&(ppVar2->first).d);
      if (pQVar5->needResendWithCredentials == false) {
        if (connectionType == DirectConnection) {
          QHttpNetworkReply::finished((QHttpNetworkReply *)object);
        }
        else {
          local_60 = 0x1f634a;
          uStack_5c = 0;
          uStack_58 = 0;
          uStack_54 = 0;
          QMetaObject::invokeMethod<void(QHttpNetworkReply::*)()>
                    (object,(offset_in_QHttpNetworkReply_to_subr *)&local_60,connectionType);
        }
      }
    }
    if ((iVar1 == 0x191) || (iVar1 == 0x197)) goto LAB_001e1b99;
  }
  pQVar3 = QtPrivateLogging::QT_HTTP2();
  if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_48 = pQVar3->name;
    local_60 = 2;
    uStack_5c = 0;
    uStack_58 = 0;
    uStack_54 = 0;
    uStack_50 = 0;
    local_4c = 0;
    QMessageLogger::debug();
    pQVar4 = QDebug::operator<<(&local_40,"stream");
    pQVar4 = QDebug::operator<<(pQVar4,stream_local->m_streamID);
    QDebug::operator<<(pQVar4,"closed");
    QDebug::~QDebug(&local_40);
  }
  QObject::deleteLater();
LAB_001e1b99:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::finishStream(QHttp2Stream *stream, Qt::ConnectionType connectionType)
{
    if (stream->state() != QHttp2Stream::State::Closed)
        stream->sendRST_STREAM(CANCEL);

    auto &pair = requestReplyPairs[stream];
    auto *httpReply = pair.second;
    if (httpReply) {
        int statusCode = httpReply->statusCode();
        if (statusCode == 401 || statusCode == 407) {
            // handleAuthorization will either re-send the request or
            // finishWithError. In either case we don't want to emit finished
            // here.
            handleAuthorization(stream);
            return;
        }

        httpReply->disconnect(this);

        if (!pair.first.d->needResendWithCredentials) {
            if (connectionType == Qt::DirectConnection)
                emit httpReply->finished();
            else
                QMetaObject::invokeMethod(httpReply, &QHttpNetworkReply::finished, connectionType);
        }
    }

    qCDebug(QT_HTTP2) << "stream" << stream->streamID() << "closed";
    stream->deleteLater();
}